

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_msgpack_string
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,string_t *result)

{
  bool bVar1;
  byte bVar2;
  allocator<char> *__a;
  char *in_RDI;
  undefined4 unaff_retaddr;
  input_format_t unaff_retaddr_00;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  string last_token;
  uint32_t len_2;
  uint16_t len_1;
  uint8_t len;
  string_t *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffef0;
  uint *in_stack_fffffffffffffef8;
  long *plVar3;
  undefined8 in_stack_ffffffffffffff00;
  input_format_t format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined5 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  input_format_t in_stack_ffffffffffffff44;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [40];
  string local_40 [32];
  undefined4 local_20;
  undefined2 local_1c;
  undefined1 local_19;
  char *context;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  format = (input_format_t)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  context = in_RDI;
  bVar1 = unexpect_eof((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                        *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,
                       (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __a = (allocator<char> *)(ulong)(*(int *)(in_RDI + 0x10) - 0xa0);
    switch(__a) {
    case (allocator<char> *)0x0:
    case (allocator<char> *)0x1:
    case (allocator<char> *)0x2:
    case (allocator<char> *)0x3:
    case (allocator<char> *)0x4:
    case (allocator<char> *)0x5:
    case (allocator<char> *)0x6:
    case (allocator<char> *)0x7:
    case (allocator<char> *)0x8:
    case (allocator<char> *)0x9:
    case (allocator<char> *)0xa:
    case (allocator<char> *)0xb:
    case (allocator<char> *)0xc:
    case (allocator<char> *)0xd:
    case (allocator<char> *)0xe:
    case (allocator<char> *)0xf:
    case (allocator<char> *)0x10:
    case (allocator<char> *)0x11:
    case (allocator<char> *)0x12:
    case (allocator<char> *)0x13:
    case (allocator<char> *)0x14:
    case (allocator<char> *)0x15:
    case (allocator<char> *)0x16:
    case (allocator<char> *)0x17:
    case (allocator<char> *)0x18:
    case (allocator<char> *)0x19:
    case (allocator<char> *)0x1a:
    case (allocator<char> *)0x1b:
    case (allocator<char> *)0x1c:
    case (allocator<char> *)0x1d:
    case (allocator<char> *)0x1e:
    case (allocator<char> *)0x1f:
      bVar2 = get_string<unsigned_int>
                        (in_stack_fffffffffffffef0,
                         (input_format_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                         (uint)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      break;
    default:
      get_token_string(in_stack_ffffffffffffff28);
      args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (in_RDI + 0x18);
      plVar3 = *(long **)(in_RDI + 0x28);
      concat<std::__cxx11::string,char_const(&)[68],std::__cxx11::string&>
                ((char (*) [68])
                 CONCAT17(in_stack_ffffffffffffff0f,
                          CONCAT16(in_stack_ffffffffffffff0e,
                                   CONCAT15(in_stack_ffffffffffffff0d,in_stack_ffffffffffffff08))),
                 args_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff20,in_RDI,__a);
      exception_message(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                        in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      parse_error::create<std::nullptr_t,_0>
                (in_stack_0000000c,CONCAT44(unaff_retaddr_00,unaff_retaddr),
                 (string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),context);
      bVar2 = (**(code **)(*plVar3 + 0x60))(plVar3,args_1,local_40,local_68);
      bVar2 = bVar2 & 1;
      parse_error::~parse_error((parse_error *)0x27c411);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_40);
      break;
    case (allocator<char> *)0x39:
      local_19 = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_char,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,
                                              CONCAT15(in_stack_ffffffffffffff0d,
                                                       in_stack_ffffffffffffff08))),format,
                         (uchar *)in_stack_fffffffffffffef8);
      bVar2 = 0;
      if (bVar1) {
        bVar2 = get_string<unsigned_char>
                          (in_stack_fffffffffffffef0,
                           (input_format_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                           (uchar)((ulong)in_stack_fffffffffffffee8 >> 0x18),
                           in_stack_fffffffffffffee0);
      }
      break;
    case (allocator<char> *)0x3a:
      local_1c = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_short,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,
                                              CONCAT15(in_stack_ffffffffffffff0d,
                                                       in_stack_ffffffffffffff08))),format,
                         (unsigned_short *)in_stack_fffffffffffffef8);
      bVar2 = 0;
      if (bVar1) {
        bVar2 = get_string<unsigned_short>
                          (in_stack_fffffffffffffef0,
                           (input_format_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                           (unsigned_short)((ulong)in_stack_fffffffffffffee8 >> 0x10),
                           in_stack_fffffffffffffee0);
      }
      break;
    case (allocator<char> *)0x3b:
      local_20 = 0;
      bVar1 = binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
              ::get_number<unsigned_int,false>
                        ((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                          *)CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,
                                              CONCAT15(in_stack_ffffffffffffff0d,
                                                       in_stack_ffffffffffffff08))),format,
                         in_stack_fffffffffffffef8);
      bVar2 = 0;
      if (bVar1) {
        bVar2 = get_string<unsigned_int>
                          (in_stack_fffffffffffffef0,
                           (input_format_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                           (uint)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      }
    }
  }
  else {
    bVar2 = 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool get_msgpack_string(string_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::msgpack, "string")))
        {
            return false;
        }

        switch (current)
        {
            // fixstr
            case 0xA0:
            case 0xA1:
            case 0xA2:
            case 0xA3:
            case 0xA4:
            case 0xA5:
            case 0xA6:
            case 0xA7:
            case 0xA8:
            case 0xA9:
            case 0xAA:
            case 0xAB:
            case 0xAC:
            case 0xAD:
            case 0xAE:
            case 0xAF:
            case 0xB0:
            case 0xB1:
            case 0xB2:
            case 0xB3:
            case 0xB4:
            case 0xB5:
            case 0xB6:
            case 0xB7:
            case 0xB8:
            case 0xB9:
            case 0xBA:
            case 0xBB:
            case 0xBC:
            case 0xBD:
            case 0xBE:
            case 0xBF:
            {
                return get_string(input_format_t::msgpack, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0xD9: // str 8
            {
                std::uint8_t len{};
                return get_number(input_format_t::msgpack, len) && get_string(input_format_t::msgpack, len, result);
            }

            case 0xDA: // str 16
            {
                std::uint16_t len{};
                return get_number(input_format_t::msgpack, len) && get_string(input_format_t::msgpack, len, result);
            }

            case 0xDB: // str 32
            {
                std::uint32_t len{};
                return get_number(input_format_t::msgpack, len) && get_string(input_format_t::msgpack, len, result);
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read,
                                        exception_message(input_format_t::msgpack, concat("expected length specification (0xA0-0xBF, 0xD9-0xDB); last byte: 0x", last_token), "string"), nullptr));
            }
        }
    }